

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallGetRuntimeDependenciesGenerator.cxx
# Opt level: O3

void __thiscall
anon_unknown.dwarf_1523740::WriteFilesArgument
          (anon_unknown_dwarf_1523740 *this,ostream *os,string_view *keyword,
          vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
          *items,string *config,cmScriptGeneratorIndent indent)

{
  char *pcVar1;
  size_type sVar2;
  ostream *poVar3;
  char *pcVar4;
  bool bVar5;
  cmScriptGeneratorIndent cVar6;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> result;
  size_type *local_150;
  size_type local_140;
  undefined8 uStack_138;
  char local_130;
  long *local_128 [2];
  long local_118 [2];
  long *local_108;
  undefined8 local_100;
  long local_f8 [2];
  ostream *local_e8;
  string local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_c0;
  undefined8 local_b0;
  long *local_a8;
  undefined8 local_a0;
  undefined1 *local_98;
  size_t local_90;
  char *pcStack_88;
  char local_80 [32];
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  local_128[0] = local_118;
  local_e8 = os;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_128,items,
             (long)&(config->_M_dataplus)._M_p +
             (long)&(items->
                    super__Vector_base<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>,_std::allocator<std::unique_ptr<cmInstallRuntimeDependencySet::Item,_std::default_delete<cmInstallRuntimeDependencySet::Item>_>_>_>
                    )._M_impl);
  pcVar4 = (char *)keyword->_M_len;
  pcVar1 = keyword->_M_str;
  if (pcVar4 != pcVar1) {
    bVar5 = true;
    do {
      local_90 = 1;
      pcStack_88 = local_80;
      local_80[0] = '\"';
      (**(code **)(**(long **)pcVar4 + 0x10))(&local_108,*(long **)pcVar4,local_128);
      local_c0._M_len = local_90;
      local_c0._M_str = pcStack_88;
      local_b0 = local_100;
      local_a8 = local_108;
      local_60 = 1;
      local_98 = local_50;
      local_50[0] = 0x22;
      local_a0 = 1;
      views._M_len = 3;
      views._M_array = &local_c0;
      local_58 = local_98;
      cmCatViews_abi_cxx11_(&local_e0,views);
      if (local_108 != local_f8) {
        operator_delete(local_108,local_f8[0] + 1);
      }
      sVar2 = local_e0._M_string_length;
      local_150 = &local_140;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p == &local_e0.field_2) {
        uStack_138 = local_e0.field_2._8_8_;
      }
      else {
        local_150 = (size_type *)local_e0._M_dataplus._M_p;
      }
      local_140 = local_e0.field_2._M_allocated_capacity;
      local_130 = '\x01';
      if (bVar5) {
        cVar6.Level = indent.Level;
        if (0 < indent.Level) {
          do {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
            cVar6.Level = cVar6.Level + -1;
          } while (cVar6.Level != 0);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"  ",2);
        poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)this,*(char **)&local_e8->field_0x8,
                            (long)local_e8->_vptr_basic_ostream);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      }
      cVar6.Level = indent.Level;
      if (0 < indent.Level) {
        do {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
          cVar6.Level = cVar6.Level + -1;
        } while (cVar6.Level != 0);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"    ",4);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)this,(char *)local_150,sVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      if ((local_130 == '\x01') && (local_130 = '\0', local_150 != &local_140)) {
        operator_delete(local_150,local_140 + 1);
      }
      pcVar4 = pcVar4 + 8;
      bVar5 = false;
    } while (pcVar4 != pcVar1);
  }
  if (local_128[0] != local_118) {
    operator_delete(local_128[0],local_118[0] + 1);
  }
  return;
}

Assistant:

void WriteFilesArgument(
  std::ostream& os, const cm::string_view& keyword,
  const std::vector<std::unique_ptr<cmInstallRuntimeDependencySet::Item>>&
    items,
  const std::string& config, cmScriptGeneratorIndent indent)
{
  WriteMultiArgument(
    os, keyword, items, indent,
    [config](const std::unique_ptr<cmInstallRuntimeDependencySet::Item>& i)
      -> std::string { return cmStrCat('"', i->GetItemPath(config), '"'); });
}